

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledOutputFile::Data::Data(Data *this,int numThreads)

{
  size_type sVar1;
  reference ppTVar2;
  V2f *in_RDI;
  size_t i;
  V2f *pVVar3;
  DeepFrameBuffer *in_stack_ffffffffffffff90;
  V2f *this_00;
  Vec2<float> *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  LevelMode r;
  int *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong __n;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  LevelMode in_stack_ffffffffffffffdc;
  TileOffsets *in_stack_ffffffffffffffe0;
  Vec2<float> local_14 [2];
  
  this_01 = local_14;
  pVVar3 = in_RDI;
  Imath_2_5::Vec2<float>::Vec2(this_01,0.0,0.0);
  r = ONE_LEVEL;
  Header::Header((Header *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8,0.0,
                 pVVar3,(float)((ulong)this_01 >> 0x20),(LineOrder)this_01,
                 (Compression)((ulong)in_RDI >> 0x20));
  TileDescription::TileDescription((TileDescription *)(pVVar3 + 8),0x20,0x20,r,r);
  DeepFrameBuffer::DeepFrameBuffer(in_stack_ffffffffffffff90);
  in_RDI[0x1c].x = 0.0;
  in_RDI[0x1c].y = 0.0;
  in_RDI[0x1d].x = 0.0;
  in_RDI[0x1d].y = 0.0;
  TileOffsets::TileOffsets
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
             (int *)CONCAT44(r,in_stack_ffffffffffffffc0));
  std::
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
            *)0x1f3363);
  pVVar3 = in_RDI + 0x27;
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)0x1f3379);
  in_RDI[0x2a].x = 0.0;
  in_RDI[0x2a].y = 0.0;
  this_00 = in_RDI + 0x2b;
  std::
  map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
  ::map((map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
         *)0x1f339a);
  anon_unknown_7::TileCoord::TileCoord((TileCoord *)(in_RDI + 0x31),0,0,0,0);
  in_RDI[0x33].x = -NAN;
  in_RDI[0x38].x = 0.0;
  in_RDI[0x38].y = 0.0;
  *(undefined1 *)&in_RDI[0x39].x = 1;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::resize((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)this_00,(size_type)pVVar3);
  uVar4 = 0;
  while( true ) {
    __n = uVar4;
    sVar1 = std::
            vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                    *)(in_RDI + 0x27));
    if (sVar1 <= uVar4) break;
    ppTVar2 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(in_RDI + 0x27),__n);
    *ppTVar2 = (value_type)0x0;
    uVar4 = __n + 1;
  }
  return;
}

Assistant:

DeepTiledOutputFile::Data::Data (int numThreads):
    numXTiles(0),
    numYTiles(0),
    tileOffsetsPosition (0),
    partNumber(-1),
    _streamData(NULL),
    _deleteStream(true)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
    for (size_t i = 0; i < tileBuffers.size(); i++)
        tileBuffers[i] = 0;
}